

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamToolsIndex::CloseFile(BamToolsIndex *this)

{
  IBamIODevice *pIVar1;
  pointer pBVar2;
  int iVar3;
  
  pIVar1 = (this->m_resources).Device;
  if (pIVar1 != (IBamIODevice *)0x0) {
    iVar3 = (*pIVar1->_vptr_IBamIODevice[10])();
    if ((char)iVar3 != '\0') {
      (*((this->m_resources).Device)->_vptr_IBamIODevice[2])();
      pIVar1 = (this->m_resources).Device;
      if (pIVar1 != (IBamIODevice *)0x0) {
        (*pIVar1->_vptr_IBamIODevice[1])();
      }
      (this->m_resources).Device = (IBamIODevice *)0x0;
    }
  }
  pBVar2 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indexFileSummary).
      super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar2) {
    (this->m_indexFileSummary).
    super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  return;
}

Assistant:

void BamToolsIndex::CloseFile(void) {
    if ( IsDeviceOpen() ) {
        m_resources.Device->Close();
        delete m_resources.Device;
        m_resources.Device = 0;
    }
    m_indexFileSummary.clear();
}